

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O0

char * get_prompt(lua_State *L,int firstline)

{
  char *pcVar1;
  int in_ESI;
  undefined8 in_RDI;
  int idx;
  char *p;
  char *in_stack_00000020;
  int in_stack_0000002c;
  lua_State *in_stack_00000030;
  undefined4 in_stack_fffffffffffffff0;
  
  idx = (int)((ulong)in_RDI >> 0x20);
  lua_getfield(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  pcVar1 = lua_tolstring((lua_State *)p,idx,(size_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if ((pcVar1 == (char *)0x0) && (pcVar1 = ">> ", in_ESI != 0)) {
    pcVar1 = "> ";
  }
  lua_settop((lua_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)pcVar1 >> 0x20));
  return pcVar1;
}

Assistant:

static const char* get_prompt(lua_State *L, int firstline)
{
  const char *p;
  lua_getfield(L, LUA_GLOBALSINDEX, firstline ? "_PROMPT" : "_PROMPT2");
  p = lua_tostring(L, -1);
  if (p == NULL) p = firstline ? LUA_PROMPT : LUA_PROMPT2;
  lua_pop(L, 1);  /* remove global */
  return p;
}